

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

UConverterType ucnv_getType_63(UConverter *converter)

{
  char cVar1;
  int8_t type;
  UConverter *converter_local;
  
  cVar1 = converter->sharedData->staticData->conversionType;
  if (cVar1 == '\x02') {
    converter_local._4_4_ = ucnv_MBCSGetType_63(converter);
  }
  else {
    converter_local._4_4_ = (UConverterType)cVar1;
  }
  return converter_local._4_4_;
}

Assistant:

U_CAPI UConverterType  U_EXPORT2
ucnv_getType(const UConverter* converter)
{
    int8_t type = converter->sharedData->staticData->conversionType;
#if !UCONFIG_NO_LEGACY_CONVERSION
    if(type == UCNV_MBCS) {
        return ucnv_MBCSGetType(converter);
    }
#endif
    return (UConverterType)type;
}